

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh_ngon.cpp
# Opt level: O2

uint ON_MeshNgon::FindPlanarNgons
               (ON_3dPointListRef *vertex_list,ON_MeshFaceList *face_list,uint **vertex_face_map,
               double planar_tolerance,uint minimum_ngon_vertex_count,uint minimum_ngon_face_count,
               bool bAllowHoles,ON_MeshNgonAllocator *NgonAllocator,
               ON_SimpleArray<unsigned_int> *NgonMap,ON_SimpleArray<ON_MeshNgon_*> *Ngons)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  uint *puVar5;
  undefined1 auVar6 [16];
  uint uVar7;
  bool bVar8;
  uint uVar9;
  uint uVar10;
  uint *puVar11;
  uint *puVar12;
  ON__UINT_PTR OVar13;
  ON_3dPoint *pOVar14;
  NgonNeighbors *pNVar15;
  long lVar16;
  ulong uVar17;
  uint uVar18;
  double (*buffer_00) [3];
  ulong uVar19;
  ulong uVar20;
  undefined7 in_register_00000089;
  uint uVar21;
  uint uVar22;
  long lVar23;
  uint *puVar24;
  long lVar25;
  ulong newcap;
  bool bVar26;
  double dVar27;
  undefined1 auVar28 [16];
  double dVar29;
  double dVar30;
  double dVar31;
  uint local_28c;
  uint local_27c;
  uint local_26c;
  ON_MeshFaceList *local_268;
  ON_SimpleArray<unsigned_int> ngon_fi;
  uint nbr_face_index;
  ulong local_228;
  uint **local_220;
  double local_218;
  ON_MeshNgon *ngon;
  ON_SimpleArray<NgonNeighbors> ngon_nbr_map;
  ON_SimpleArray<unsigned_int> ngon_vi;
  ON_3dVector A;
  uint local_1b8 [6];
  ulong local_1a0;
  undefined4 local_198;
  uint local_194;
  uint local_190;
  uint local_18c;
  uint Fvi [4];
  ON_3dVector B;
  uint Fvi_1 [4];
  double local_128;
  double buffer [4] [3];
  undefined1 local_68 [16];
  double local_58;
  double dStack_50;
  ON_MeshVertexFaceMap ws_vfmap;
  
  local_198 = (undefined4)CONCAT71(in_register_00000089,bAllowHoles);
  uVar2 = Ngons->m_count;
  uVar10 = vertex_list->m_point_count;
  uVar22 = face_list->m_face_count;
  newcap = (ulong)uVar22;
  bVar1 = face_list->m_bQuadFaces;
  local_268 = face_list;
  local_220 = vertex_face_map;
  local_194 = minimum_ngon_face_count;
  ON_MeshVertexFaceMap::ON_MeshVertexFaceMap(&ws_vfmap);
  ngon_vi._vptr_ON_SimpleArray = (_func_int **)&PTR__ON_SimpleArray_0081fa28;
  ngon_vi.m_a = (uint *)0x0;
  ngon_vi.m_count = 0;
  ngon_vi.m_capacity = 0;
  ngon_fi._vptr_ON_SimpleArray = (_func_int **)&PTR__ON_SimpleArray_0081fa28;
  ngon_fi.m_a = (uint *)0x0;
  ngon_fi.m_count = 0;
  ngon_fi.m_capacity = 0;
  ngon_nbr_map._vptr_ON_SimpleArray = (_func_int **)&PTR__ON_SimpleArray_00826fa0;
  ngon_nbr_map.m_a = (NgonNeighbors *)0x0;
  ngon_nbr_map.m_count = 0;
  ngon_nbr_map.m_capacity = 0;
  ON_PlaneEquation::ON_PlaneEquation((ON_PlaneEquation *)local_68);
  if ((uVar22 == 0 || uVar22 != NgonMap->m_count) && (-1 < NgonMap->m_capacity)) {
    NgonMap->m_count = 0;
  }
  if (uVar10 != 0 && uVar22 != 0) {
    if (local_220 == (uint **)0x0) {
      bVar8 = ON_MeshVertexFaceMap::SetFromFaceList(&ws_vfmap,uVar10,local_268,false);
      local_220 = ws_vfmap.m_vertex_face_map;
      if (ws_vfmap.m_vertex_face_map == (uint **)0x0 || !bVar8) goto LAB_0053c90d;
    }
    ON_SimpleArray<unsigned_int>::Reserve(&ngon_vi,0x80);
    ON_SimpleArray<unsigned_int>::Reserve(&ngon_fi,0x80);
    ON_SimpleArray<NgonNeighbors>::Reserve(&ngon_nbr_map,0x80);
    if (uVar22 == NgonMap->m_count) {
      puVar24 = NgonMap->m_a;
    }
    else {
      ON_SimpleArray<unsigned_int>::Reserve(NgonMap,newcap);
      if ((-1 < (int)uVar22) && ((int)uVar22 <= NgonMap->m_capacity)) {
        NgonMap->m_count = uVar22;
      }
      puVar24 = NgonMap->m_a;
      for (uVar19 = 0; newcap != uVar19; uVar19 = uVar19 + 1) {
        puVar24[uVar19] = 0xffffffff;
      }
    }
    bVar8 = false;
    local_27c = 0;
    local_28c = uVar2;
    for (uVar19 = 0; uVar19 != newcap; uVar19 = uVar19 + 1) {
      if ((((puVar24[uVar19] == 0xffffffff) &&
           (local_1a0 = uVar19, ON_MeshFaceList::QuadFvi(local_268,(uint)uVar19,Fvi),
           uVar19 = local_1a0, Fvi[0] != Fvi[1])) && (Fvi[1] != Fvi[2])) &&
         (Fvi[0] != Fvi[(ulong)bVar1 + 2])) {
        uVar10 = vertex_list->m_point_count;
        buffer_00 = buffer;
        for (lVar25 = 0; (ulong)bVar1 + 3 != lVar25; lVar25 = lVar25 + 1) {
          uVar19 = local_1a0;
          if (uVar10 <= Fvi[lVar25]) goto LAB_0053be50;
          ON_3dPointListRef::GetPoint(vertex_list,Fvi[lVar25],*buffer_00);
          buffer_00 = buffer_00 + 1;
        }
        if (bVar1 == false) {
          buffer[3][2] = buffer[2][2];
          buffer[3][0] = buffer[2][0];
          buffer[3][1] = buffer[2][1];
        }
        ON_3dVector::ON_3dVector
                  (&A,buffer[2][0] - buffer[0][0],buffer[2][1] - buffer[0][1],
                   buffer[2][2] - buffer[0][2]);
        uVar19 = local_1a0;
        ON_3dVector::ON_3dVector
                  (&B,buffer[3][0] - buffer[1][0],buffer[3][1] - buffer[1][1],
                   buffer[3][2] - buffer[1][2]);
        ON_3dVector::ON_3dVector
                  ((ON_3dVector *)Fvi_1,A.y * B.z - A.z * B.y,A.z * B.x - B.z * A.x,
                   A.x * B.y - A.y * B.x);
        dVar30 = ON_3dVector::Length((ON_3dVector *)Fvi_1);
        if (0.0 < dVar30) {
          auVar6._4_4_ = Fvi_1[1];
          auVar6._8_4_ = Fvi_1[2];
          auVar6._12_4_ = Fvi_1[3];
          auVar6._0_4_ = Fvi_1[0];
          auVar28._8_8_ = dVar30;
          auVar28._0_8_ = dVar30;
          auVar28 = divpd(auVar6,auVar28);
          dVar30 = local_128 / dVar30;
          dVar29 = auVar28._8_8_;
          dVar27 = auVar28._0_8_;
          dVar31 = buffer[0][2] * dVar30 + buffer[0][0] * dVar27 + buffer[0][1] * dVar29;
          if (((ABS((buffer[1][2] * dVar30 + buffer[1][0] * dVar27 + buffer[1][1] * dVar29) - dVar31
                   ) <= planar_tolerance) &&
              (ABS((buffer[2][2] * dVar30 + buffer[2][0] * dVar27 + buffer[2][1] * dVar29) - dVar31)
               <= planar_tolerance)) &&
             (ABS((buffer[3][2] * dVar30 + buffer[3][0] * dVar27 + dVar29 * buffer[3][1]) - dVar31)
              <= planar_tolerance)) {
            ngon = (ON_MeshNgon *)0x0;
            local_26c = (uint)uVar19;
            if (-1 < (long)ngon_fi._16_8_) {
              ngon_fi._16_8_ = ngon_fi._16_8_ & 0xffffffff00000000;
            }
            uVar10 = vertex_list->m_point_count;
            A.x = dVar27;
            A.y = dVar29;
            A.z = dVar30;
            local_68 = auVar28;
            local_58 = dVar30;
            dStack_50 = -dVar31;
            ON_SimpleArray<unsigned_int>::Append(&ngon_fi,&local_26c);
            if (-1 < (long)ngon_nbr_map._16_8_) {
              ngon_nbr_map._16_8_ = ngon_nbr_map._16_8_ & 0xffffffff00000000;
            }
            ON_SimpleArray<NgonNeighbors>::AppendNew(&ngon_nbr_map);
            puVar24[local_26c] = local_28c;
            local_228 = 0;
            uVar22 = 0;
            while( true ) {
              uVar20 = ngon_fi._16_8_ & 0xffffffff;
              if ((uint)ngon_fi.m_count <= (uint)local_228) break;
              uVar17 = local_228 & 0xffffffff;
              local_228 = uVar20;
              for (; uVar17 != local_228; uVar17 = uVar17 + 1) {
                local_18c = ngon_fi.m_a[uVar17];
                ON_MeshFaceList::QuadFvi(local_268,local_18c,Fvi_1);
                if ((uVar10 < Fvi_1[0]) || (puVar12 = local_220[Fvi_1[0]], puVar12 == (uint *)0x0))
                {
                  puVar11 = (uint *)0x0;
                }
                else {
                  puVar11 = (uint *)0x0;
                  if (1 < *puVar12) {
                    puVar11 = puVar12;
                  }
                }
                lVar25 = 0;
                uVar19 = (ulong)Fvi_1[0];
                uVar7 = uVar22;
LAB_0053c24e:
                uVar22 = uVar7;
                lVar16 = lVar25;
                puVar12 = puVar11;
                if (lVar16 != 4) {
                  lVar25 = lVar16 + 1;
                  uVar3 = Fvi_1[(uint)lVar25 & 3];
                  uVar20 = (ulong)uVar3;
                  uVar21 = (uint)uVar19;
                  puVar11 = puVar12;
                  uVar19 = uVar20;
                  uVar7 = uVar22;
                  if (uVar21 != uVar3) {
                    uVar18 = uVar22 + 1;
                    puVar11 = (uint *)0x0;
                    uVar7 = uVar18;
                    if (uVar3 <= uVar10) {
                      puVar5 = local_220[uVar20];
                      puVar11 = (uint *)0x0;
                      if ((((puVar5 != (uint *)0x0) && (puVar11 = (uint *)0x0, 1 < *puVar5)) &&
                          (puVar11 = puVar5, puVar12 != (uint *)0x0)) &&
                         (uVar7 = uVar22, ngon_nbr_map.m_a[uVar17].m_NFS[lVar16] == 0)) {
                        OVar13 = uVar17 * 8 + lVar16 + 4;
                        uVar9 = 1;
                        local_190 = uVar18;
LAB_0053c321:
                        uVar7 = local_190;
                        if (uVar9 <= *puVar12) {
                          local_218 = (double)CONCAT44(local_218._4_4_,uVar9);
                          nbr_face_index = puVar12[uVar9];
                          if (((local_18c != nbr_face_index) && (local_26c < nbr_face_index)) &&
                             (puVar24[nbr_face_index] == 0xffffffff ||
                              puVar24[nbr_face_index] == local_28c)) {
                            ON_MeshFaceList::QuadFvi(local_268,nbr_face_index,local_1b8);
                            for (lVar23 = 4; lVar23 != 8; lVar23 = lVar23 + 1) {
                              if ((uVar3 == *(uint *)((long)&A.z + lVar23 * 4)) &&
                                 (uVar21 == local_1b8[(int)lVar23 - 3U & 3])) {
                                buffer[0][2] = A.z;
                                buffer[0][0] = A.x;
                                buffer[0][1] = A.y;
                                buffer[1][0] = -dVar31;
                                pOVar14 = ON_3dPointListRef::GetPoint(vertex_list,local_1b8[0],&B.x)
                                ;
                                dVar30 = ON_PlaneEquation::ValueAt
                                                   ((ON_PlaneEquation *)buffer,*pOVar14);
                                if (planar_tolerance < ABS(dVar30)) break;
                                pOVar14 = ON_3dPointListRef::GetPoint(vertex_list,local_1b8[1],&B.x)
                                ;
                                dVar30 = ON_PlaneEquation::ValueAt
                                                   ((ON_PlaneEquation *)buffer,*pOVar14);
                                if (planar_tolerance < ABS(dVar30)) break;
                                pOVar14 = ON_3dPointListRef::GetPoint(vertex_list,local_1b8[2],&B.x)
                                ;
                                dVar30 = ON_PlaneEquation::ValueAt
                                                   ((ON_PlaneEquation *)buffer,*pOVar14);
                                if (planar_tolerance < ABS(dVar30)) break;
                                if (local_1b8[3] != local_1b8[2]) {
                                  pOVar14 = ON_3dPointListRef::GetPoint
                                                      (vertex_list,local_1b8[3],&B.x);
                                  dVar30 = ON_PlaneEquation::ValueAt
                                                     ((ON_PlaneEquation *)buffer,*pOVar14);
                                  if (planar_tolerance < ABS(dVar30)) break;
                                }
                                uVar20 = ngon_fi._16_8_ & 0xffffffff;
                                if (puVar24[nbr_face_index] != 0xffffffff) goto LAB_0053c530;
                                puVar24[nbr_face_index] = local_28c;
                                ON_SimpleArray<unsigned_int>::Append(&ngon_fi,&nbr_face_index);
                                pNVar15 = ON_SimpleArray<NgonNeighbors>::AppendNew(&ngon_nbr_map);
                                pNVar15[-1].m_NFS[lVar23] = OVar13;
                                goto LAB_0053c5a4;
                              }
                            }
                          }
                          goto LAB_0053c5ab;
                        }
                      }
                    }
                  }
                  goto LAB_0053c24e;
                }
                uVar19 = local_1a0;
              }
            }
            local_228 = uVar20;
            if ((uVar22 < minimum_ngon_vertex_count) || ((uint)ngon_fi.m_count < local_194)) {
LAB_0053c862:
              uVar10 = 0xffffffff;
LAB_0053c864:
              if (ngon != (ON_MeshNgon *)0x0) {
                ON_SimpleArray<ON_MeshNgon_*>::Append(Ngons,&ngon);
                local_28c = local_28c + 1;
                goto LAB_0053be50;
              }
            }
            else {
              if (-1 < (long)ngon_vi._16_8_) {
                ngon_vi._16_8_ = ngon_vi._16_8_ & 0xffffffff00000000;
              }
              local_27c = local_27c + 1;
              uVar10 = GetNgonBoundarySegments
                                 (local_268,ngon_fi.m_count,ngon_fi.m_a,local_27c,ngon_nbr_map.m_a,
                                  &ngon_vi,(ON_SimpleArray<unsigned_int> *)0x0);
              if ((uVar10 == 0) || ((uint)ngon_vi.m_count < minimum_ngon_vertex_count))
              goto LAB_0053c862;
              if ((uint)ngon_vi.m_count < uVar22) {
                ON_3dPointListRef::operator[]((ON_3dPoint *)&A,vertex_list,*ngon_vi.m_a);
                ON_PlaneEquation::UnitNormal(&B,(ON_PlaneEquation *)local_68);
                ON_Plane::ON_Plane((ON_Plane *)buffer,(ON_3dPoint *)&A,&B);
                local_218 = Internal_NgonBoundaryArea((ON_Plane *)buffer,vertex_list,&ngon_vi);
                do {
                  A.x = (double)&PTR__ON_SimpleArray_0081fa28;
                  A.y = 0.0;
                  A.z = 0.0;
                  local_27c = local_27c + 1;
                  uVar10 = GetNgonBoundarySegments
                                     (local_268,ngon_fi.m_count,ngon_fi.m_a,local_27c,
                                      ngon_nbr_map.m_a,(ON_SimpleArray<unsigned_int> *)&A,
                                      (ON_SimpleArray<unsigned_int> *)0x0);
                  bVar26 = 2 < A.z._0_4_;
                  if ((bVar26 && uVar10 != 0) &&
                     (dVar30 = Internal_NgonBoundaryArea
                                         ((ON_Plane *)buffer,vertex_list,
                                          (ON_SimpleArray<unsigned_int> *)&A), local_218 < dVar30))
                  {
                    local_218 = dVar30;
                    ON_SimpleArray<unsigned_int>::operator=
                              (&ngon_vi,(ON_SimpleArray<unsigned_int> *)&A);
                  }
                  ON_SimpleArray<unsigned_int>::~ON_SimpleArray((ON_SimpleArray<unsigned_int> *)&A);
                } while (bVar26 && uVar10 != 0);
                ON_Plane::~ON_Plane((ON_Plane *)buffer);
                if ((char)local_198 != '\0') {
                  goto LAB_0053c810;
                }
                bVar8 = true;
                uVar10 = 0xfffffffe;
                goto LAB_0053c864;
              }
LAB_0053c810:
              ngon = ON_MeshNgonAllocator::AllocateNgon
                               (NgonAllocator,ngon_vi.m_count,ngon_fi.m_count);
              if (ngon != (ON_MeshNgon *)0x0) {
                memcpy(ngon->m_vi,ngon_vi.m_a,(ulong)ngon->m_Vcount << 2);
                memcpy(ngon->m_fi,ngon_fi.m_a,(ulong)ngon->m_Fcount << 2);
                goto LAB_0053c862;
              }
              uVar10 = 0xffffffff;
            }
            for (uVar20 = 0; (ngon_fi._16_8_ & 0xffffffff) != uVar20; uVar20 = uVar20 + 1) {
              if (puVar24[(int)ngon_fi.m_a[uVar20]] == local_28c) {
                puVar24[(int)ngon_fi.m_a[uVar20]] = uVar10;
              }
            }
          }
        }
      }
LAB_0053be50:
    }
    if (bVar8) {
      for (uVar19 = 0; newcap != uVar19; uVar19 = uVar19 + 1) {
        if (puVar24[uVar19] == 0xfffffffe) {
          puVar24[uVar19] = 0xffffffff;
        }
      }
    }
  }
LAB_0053c90d:
  iVar4 = Ngons->m_count;
  ON_SimpleArray<NgonNeighbors>::~ON_SimpleArray(&ngon_nbr_map);
  ON_SimpleArray<unsigned_int>::~ON_SimpleArray(&ngon_fi);
  ON_SimpleArray<unsigned_int>::~ON_SimpleArray(&ngon_vi);
  ON_MeshVertexFaceMap::~ON_MeshVertexFaceMap(&ws_vfmap);
  return iVar4 - uVar2;
  while (nbr_face_index != ngon_fi.m_a[uVar20]) {
LAB_0053c530:
    uVar20 = (ulong)((int)uVar20 - 1);
    if (uVar20 <= uVar17) goto LAB_0053c5ab;
  }
  if (ngon_nbr_map.m_a[uVar20 - 1].m_NFS[lVar23] == 0) {
    ngon_nbr_map.m_a[uVar20 - 1].m_NFS[lVar23] = OVar13;
LAB_0053c5a4:
    if (uVar17 < uVar20) {
      ngon_nbr_map.m_a[uVar17].m_NFS[lVar16] = uVar20 * 8 + lVar23;
      uVar7 = uVar22;
      goto LAB_0053c24e;
    }
  }
LAB_0053c5ab:
  uVar9 = local_218._0_4_ + 1;
  goto LAB_0053c321;
}

Assistant:

unsigned int ON_MeshNgon::FindPlanarNgons(
  const ON_3dPointListRef& vertex_list,
  const ON_MeshFaceList& face_list,
  const unsigned int *const* vertex_face_map,
  double planar_tolerance,
  unsigned int minimum_ngon_vertex_count,
  unsigned int minimum_ngon_face_count,
  bool bAllowHoles,
  ON_MeshNgonAllocator& NgonAllocator,
  ON_SimpleArray<unsigned int>& NgonMap,
  ON_SimpleArray<ON_MeshNgon*>& Ngons
  )
{
  const unsigned int NgonsCount0 = Ngons.UnsignedCount();
  const unsigned int vertex_count = vertex_list.PointCount();
  const unsigned int face_count = face_list.FaceCount();
  unsigned int ngon_boundary_index = 0;
  const bool bQuadFaces = (4 == face_list.FaceVertexCount());

  ON_MeshVertexFaceMap ws_vfmap;

  ON_MeshNgon* ngon;
  unsigned int Fvi[4];
  unsigned int face_index, ngon_boundary_edge_count;
  ON_SimpleArray<unsigned int> ngon_vi;
  ON_SimpleArray<unsigned int> ngon_fi;
  ON_SimpleArray<struct NgonNeighbors> ngon_nbr_map;
  ON_PlaneEquation e;

  bool bCleanUpNgonMap = false;

  for (;;)
  {
    if ( face_count <= 0 || face_count != NgonMap.UnsignedCount() )
      NgonMap.SetCount(0);

    if ( face_count <= 0 || vertex_count <= 0 )
      break;
   
    if ( 0 == vertex_face_map )
    {
      if ( !ws_vfmap.SetFromFaceList(vertex_count,face_list,false) )
        break;
      vertex_face_map = ws_vfmap.VertexFaceMap();
      if ( 0 == vertex_face_map )
        break;
    }

    ngon_vi.Reserve(128);
    ngon_fi.Reserve(128);
    ngon_nbr_map.Reserve(128);

    unsigned int* ngonMap = NgonMap.Array();
    if ( face_count != NgonMap.UnsignedCount() )
    {
      NgonMap.Reserve(face_count);
      NgonMap.SetCount(face_count);
      ngonMap = NgonMap.Array(); // in case a reallocation occurred.
      for ( face_index = 0; face_index < face_count; face_index++ )
        ngonMap[face_index] = ON_UNSET_UINT_INDEX;
    }

    int ngonIndex = NgonsCount0;
    unsigned int ngonUnsetIndex;
    const unsigned int omitted_face_mark = ON_UNSET_UINT_INDEX - 1;

    for ( face_index = 0; face_index < face_count; face_index++ )
    {
      if ( ON_UNSET_UINT_INDEX != ngonMap[face_index] )
        continue; // this face is not eligable for being in an n-gon

      face_list.QuadFvi(face_index,Fvi);
      if ( !GetFacePlaneEquation(vertex_list,bQuadFaces,Fvi,planar_tolerance,e) )
        continue; // degenerate face

      for (;;)
      {
        ngon = 0;
        ngonUnsetIndex = ON_UNSET_UINT_INDEX;

        // Note:
        //   ngon_boundary_count includes interior edges when the n-gon has holes
        ngon_boundary_edge_count = GetCoplanarConnectedFaces(
          vertex_list,
          face_list,
          ngonIndex, ngonMap, vertex_face_map,
          planar_tolerance, face_index, e, 
          ngon_fi,
          ngon_nbr_map
          );

        if ( ngon_boundary_edge_count < minimum_ngon_vertex_count )
          break;

        if ( ngon_fi.UnsignedCount() < minimum_ngon_face_count )
          break;

        ngon_boundary_index++;
        ngon_vi.SetCount(0);
        if ( !GetNgonBoundarySegments(face_list,
                            ngon_fi.UnsignedCount(),ngon_fi.Array(),
                            ngon_boundary_index,
                            ngon_nbr_map.Array(),
                            &ngon_vi,
                            0
                            ) 
           )
          break;

        if ( ngon_vi.UnsignedCount() < minimum_ngon_vertex_count )
          break;

        if ( ngon_vi.UnsignedCount() < ngon_boundary_edge_count )
        {
          // ngon has holes.
          // The boundary with the largest area is the outer boundary.
          const ON_Plane ngon_plane(vertex_list[ngon_vi[0]], e.UnitNormal());

          double ngon_vi_area = Internal_NgonBoundaryArea(ngon_plane, vertex_list, ngon_vi);

          for(;;)
          {
            ON_SimpleArray<unsigned int> ngon_vi1;
            ngon_boundary_index++;
            if ( !GetNgonBoundarySegments(face_list,
                                ngon_fi.UnsignedCount(),ngon_fi.Array(),
                                ngon_boundary_index,
                                ngon_nbr_map.Array(),
                                &ngon_vi1, 0) 
               )
              break;
            if ( ngon_vi1.UnsignedCount() < 3 )
              break;
            double ngon_vi1_area = Internal_NgonBoundaryArea(ngon_plane, vertex_list, ngon_vi1);
            if (ngon_vi1_area > ngon_vi_area)
            {
              ngon_vi_area = ngon_vi1_area;
              ngon_vi = ngon_vi1;
            }
          }

          if (false == bAllowHoles)
          {
            ngonUnsetIndex = omitted_face_mark;
            bCleanUpNgonMap = true;
            break;
          }
        }

        ngon = NgonAllocator.AllocateNgon(ngon_vi.UnsignedCount(),ngon_fi.UnsignedCount());
        if ( 0 == ngon )
          break;

        memcpy(ngon->m_vi,ngon_vi.Array(),ngon->m_Vcount*sizeof(ngon->m_vi[0]));
        memcpy(ngon->m_fi,ngon_fi.Array(),ngon->m_Fcount*sizeof(ngon->m_fi[0]));
        break; // finished new ngon
      }

      if (0 == ngon)
      {
        // undo any modifications that were made to ngonMap[]
        UnsetNgonMap(ngon_fi.Array(),ngon_fi.UnsignedCount(),ngonIndex,ngonUnsetIndex,ngonMap);
        continue;
      }

      // found a new ngon
      Ngons.Append(ngon);
      ngonIndex++;
    }
    if (bCleanUpNgonMap)
    {
      for (face_index = 0; face_index < face_count; face_index++)
      {
        if (omitted_face_mark == ngonMap[face_index])
          ngonMap[face_index] = ON_UNSET_UINT_INDEX;
      }
    }
    break;
  }



  return Ngons.UnsignedCount() - NgonsCount0;
}